

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_visibility.hpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> *
eos::render::compute_per_vertex_self_occlusion
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
          vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          *viewspace_vertices,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
          *triangle_vertex_indices,RayDirection ray_direction_type)

{
  pointer paVar1;
  pointer pMVar2;
  int iVar3;
  pointer pMVar4;
  pointer paVar5;
  bool bVar6;
  bool __x;
  pair<bool,_std::optional<float>_> pVar7;
  Vector3f ray_origin;
  Vector3f local_5c;
  pointer local_50;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_48;
  Vector3f local_40;
  
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  pMVar4 = (viewspace_vertices->
           super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (viewspace_vertices->
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar4 != local_50) {
    local_48 = triangle_vertex_indices;
    do {
      local_40.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           = (pMVar4->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
      local_40.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
      _0_8_ = *(undefined8 *)
               (pMVar4->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array;
      if (ray_direction_type == Parallel) {
        local_5c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = 0.0;
        local_5c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = 0.0;
        local_5c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = 1.0;
      }
      else {
        local_5c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
        _0_8_ = *(ulong *)(pMVar4->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array ^ 0x8000000080000000;
        local_5c.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = -(pMVar4->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
      }
      paVar1 = (local_48->
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      bVar6 = true;
      __x = true;
      for (paVar5 = (local_48->
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; paVar5 != paVar1;
          paVar5 = paVar5 + 1) {
        pMVar2 = (viewspace_vertices->
                 super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pVar7 = ray_triangle_intersect
                          (&local_40,&local_5c,pMVar2 + paVar5->_M_elems[0],
                           pMVar2 + paVar5->_M_elems[1],pMVar2 + paVar5->_M_elems[2],false);
        iVar3 = 0;
        if (((undefined1  [12])pVar7 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
          if (((undefined1  [12])pVar7 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
            std::__throw_bad_optional_access();
          }
          iVar3 = 3 - (uint)(0.0001 < pVar7.second.super__Optional_base<float,_true,_true>.
                                      _M_payload.super__Optional_payload_base<float>._M_payload.
                                      _M_value);
          __x = bVar6;
          if (0.0001 < pVar7.second.super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value) {
            bVar6 = false;
            __x = false;
          }
        }
        if ((iVar3 != 3) && (iVar3 != 0)) break;
      }
      std::vector<bool,_std::allocator<bool>_>::push_back(__return_storage_ptr__,__x);
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<bool>
compute_per_vertex_self_occlusion(const std::vector<Eigen::Vector3f>& viewspace_vertices,
                                  const std::vector<std::array<int, 3>>& triangle_vertex_indices,
                                  detail::RayDirection ray_direction_type)
{
    // We are already given vertices in view space (or we should not transform them).
    std::vector<bool> per_vertex_visibility;
    for (const auto& vertex : viewspace_vertices)
    {
        const bool visible =
            is_vertex_visible(vertex, viewspace_vertices, triangle_vertex_indices, ray_direction_type);
        per_vertex_visibility.push_back(visible);
    }
    return per_vertex_visibility;
}